

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::info<char[7],char*,char[23]>
          (ConsoleLogger *this,char (*args) [7],char **args_1,char (*args_2) [23])

{
  mutex *in_RCX;
  char (*in_RDX) [7];
  ConsoleLogger *in_RSI;
  char (*in_RDI) [23];
  
  if (*(int *)(in_RDI[4] + 0x10) < 2) {
    std::mutex::lock(in_RCX);
    if ((in_RDI[4][0xc] & 1U) != 0) {
      std::operator<<(*(ostream **)*in_RDI,(string *)(*in_RDI + 8));
    }
    std::operator<<(*(ostream **)*in_RDI,"[i] ");
    if ((in_RDI[4][0xc] & 1U) != 0) {
      std::operator<<(*(ostream **)*in_RDI,"\x1b[0m");
    }
    print<char[7],char*,char[23]>(in_RSI,in_RDX,(char **)in_RCX,in_RDI);
    std::mutex::unlock((mutex *)0x10dfbe);
  }
  return;
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}